

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional-main.t.hpp
# Opt level: O0

ostream * lest::operator<<(ostream *os,optional<char> *v)

{
  ostream *poVar1;
  value_type_conflict1 *chr;
  bool local_be;
  allocator local_a9;
  string local_a8 [32];
  string local_88 [39];
  byte local_61;
  lest local_60 [32];
  string local_40 [32];
  optional<char> *local_20;
  optional<char> *v_local;
  ostream *os_local;
  
  local_20 = v;
  v_local = (optional<char> *)os;
  poVar1 = std::operator<<(os,"[optional:");
  local_be = nonstd::optional_bare::optional::operator_cast_to_bool((optional *)local_20);
  local_61 = 0;
  if (local_be) {
    chr = nonstd::optional_bare::optional<char>::operator*(local_20);
    to_string_abi_cxx11_(local_60,chr);
    local_61 = 1;
    std::__cxx11::string::string(local_40,(string *)local_60);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a8,"[empty]",&local_a9);
    std::__cxx11::string::string(local_88,local_a8);
    std::__cxx11::string::string(local_40,local_88);
  }
  local_be = !local_be;
  poVar1 = std::operator<<(poVar1,local_40);
  os_local = std::operator<<(poVar1,"]");
  std::__cxx11::string::~string(local_40);
  if (local_be) {
    std::__cxx11::string::~string(local_88);
    std::__cxx11::string::~string(local_a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  }
  if ((local_61 & 1) != 0) {
    std::__cxx11::string::~string((string *)local_60);
  }
  return os_local;
}

Assistant:

inline std::ostream & operator<<( std::ostream & os, nonstd::optional<T> const & v )
{
    using lest::to_string;
    return os << "[optional:" << (v ? to_string(*v) : "[empty]") << "]";
}